

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void * probe_access_tricore
                 (CPUArchState_conflict30 *env,target_ulong_conflict addr,int size,
                 MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  int flags;
  _Bool _Var1;
  void *pvVar2;
  size_t mmu_idx_00;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  CPUIOTLBEntry *iotlbentry;
  CPUTriCoreState *__mptr;
  
  if (-(addr | 0xffffc000) < (uint)size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4ab,"-(addr | TARGET_PAGE_MASK) >= size");
  }
  if (MMU_INST_FETCH < access_type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4bc,(char *)0x0);
  }
  mmu_idx_00 = (size_t)mmu_idx;
  uVar6 = env->gpr_a[mmu_idx_00 * 4 + -0x10] >> 6 & addr >> 0xe;
  lVar5 = (ulong)(uVar6 << 6) + *(long *)(env->gpr_a + mmu_idx_00 * 4 + -0xe);
  uVar3 = (ulong)access_type;
  flags = *(int *)(&DAT_00dd1a3c + uVar3 * 4);
  uVar4 = *(uint *)(lVar5 + uVar3 * 4);
  if ((uVar4 & 0xffffe000) != (addr & 0xffffc000)) {
    _Var1 = victim_tlb_hit(env,mmu_idx_00,(ulong)uVar6,uVar3 * 4,addr & 0xffffc000);
    if (!_Var1) {
      tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,size,access_type,mmu_idx,retaddr);
      uVar6 = addr >> 0xe & env->gpr_a[mmu_idx_00 * 4 + -0x10] >> 6;
      lVar5 = (ulong)(uVar6 << 6) + *(long *)(env->gpr_a + mmu_idx_00 * 4 + -0xe);
    }
    uVar4 = *(uint *)(uVar3 * 4 + lVar5);
  }
  uVar3 = (ulong)addr;
  if (size == 0) {
LAB_00d1bdff:
    pvVar2 = (void *)0x0;
  }
  else {
    if ((uVar4 & 0x3f00) != 0) {
      if ((uVar4 & 0xb00) != 0) goto LAB_00d1bdff;
      iotlbentry = (CPUIOTLBEntry *)
                   (*(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x5a8) + (ulong)(uVar6 << 4));
      if ((uVar4 >> 10 & 1) != 0) {
        cpu_check_watchpoint_tricore
                  ((CPUState *)&env[-0x32].cpu_model,uVar3,(ulong)(uint)size,iotlbentry->attrs,flags
                   ,retaddr);
      }
      if ((uVar4 >> 0xc & 1) != 0) {
        notdirty_write((CPUState *)&env[-0x32].cpu_model,uVar3,size,iotlbentry,retaddr);
      }
    }
    pvVar2 = (void *)(uVar3 + *(long *)(lVar5 + 0x10));
  }
  return pvVar2;
}

Assistant:

void *probe_access(CPUArchState *env, target_ulong addr, int size,
                   MMUAccessType access_type, int mmu_idx, uintptr_t retaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = env->uc;
#endif
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr;
    size_t elt_ofs = 0;
    int wp_access = 0;

#ifdef _MSC_VER
    g_assert(((target_ulong)0 - (addr | TARGET_PAGE_MASK)) >= size);
#else
    g_assert(-(addr | TARGET_PAGE_MASK) >= size);
#endif

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        wp_access = BP_MEM_READ;
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        wp_access = BP_MEM_WRITE;
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        wp_access = BP_MEM_READ;
        break;
    default:
        g_assert_not_reached();
    }
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (unlikely(!tlb_hit(env->uc, tlb_addr, addr))) {
        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs,
                            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size, access_type, mmu_idx, retaddr);
            /* TLB resize via tlb_fill may have moved the entry. */
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (!size) {
        return NULL;
    }

    if (unlikely(tlb_addr & TLB_FLAGS_MASK)) {
        CPUIOTLBEntry *iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Reject I/O access, or other required slow-path.  */
        if (tlb_addr & (TLB_MMIO | TLB_BSWAP | TLB_DISCARD_WRITE)) {
            return NULL;
        }

        /* Handle watchpoints.  */
        if (tlb_addr & TLB_WATCHPOINT) {
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, wp_access, retaddr);
        }

        /* Handle clean RAM pages.  */
        if (tlb_addr & TLB_NOTDIRTY) {
            notdirty_write(env_cpu(env), addr, size, iotlbentry, retaddr);
        }
    }

    return (void *)((uintptr_t)addr + entry->addend);
}